

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

void anon_unknown.dwarf_ac3::ndiIRCHKHelper(ndicapi *pol,char *command,char *commandReply)

{
  bool bVar1;
  int local_2c;
  unsigned_long uStack_28;
  int j;
  unsigned_long mode;
  char *commandReply_local;
  char *command_local;
  ndicapi *pol_local;
  
  uStack_28 = 1;
  if (((command[5] == ':') && (command[10] != '\r')) ||
     ((command[5] == ' ' && (command[6] != '\r')))) {
    uStack_28 = ndiHexToUnsignedLong(command + 6,4);
  }
  mode = (unsigned_long)commandReply;
  if ((uStack_28 & 1) != 0) {
    mode = (unsigned_long)(commandReply + 1);
    pol->IrchkDetected = (int)*commandReply;
  }
  if ((uStack_28 & 2) != 0) {
    local_2c = 0;
    while( true ) {
      bVar1 = false;
      if (local_2c < 0x7e) {
        bVar1 = '\x1f' < *(char *)mode;
      }
      if (!bVar1) break;
      pol->IrchkSources[local_2c] = *(char *)mode;
      local_2c = local_2c + 1;
      mode = mode + 1;
    }
  }
  return;
}

Assistant:

void ndiIRCHKHelper(ndicapi* pol, const char* command, const char* commandReply)
  {
    unsigned long mode = NDI_XFORMS_AND_STATUS; // the default reply mode
    int j;

    // if the IRCHK command had a reply mode, read it
    if ((command[5] == ':' && command[10] != '\r') || (command[5] == ' ' && command[6] != '\r'))
    {
      mode = ndiHexToUnsignedLong(&command[6], 4);
    }

    // a single character, '0' or '1'
    if (mode & NDI_DETECTED)
    {
      pol->IrchkDetected = *commandReply++;
    }

    // maximum string length for 20 sources is 2*(3 + 20*3) = 126
    // copy until a control char (less than 0x20) is found
    if (mode & NDI_SOURCES)
    {
      for (j = 0; j < 126 && *commandReply >= ' '; j++)
      {
        pol->IrchkSources[j] = *commandReply++;
      }
    }
  }